

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

string * __thiscall Kernel::Clause::toString_abi_cxx11_(Clause *this)

{
  bool bVar1;
  undefined1 uVar2;
  ProofExtra PVar3;
  uint uVar4;
  Induction IVar5;
  size_t sVar6;
  SplitSet *pSVar7;
  Clause *in_RSI;
  string *in_RDI;
  uint weightForClauseSelection;
  uint weight;
  uint var;
  uint *__end3;
  uint *__begin3;
  Stack<unsigned_int> *__range3;
  uint numVars;
  Stack<unsigned_int> vars;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> varSortMap;
  string quantifier;
  string *result;
  undefined1 in_stack_fffffffffffff7fb;
  float in_stack_fffffffffffff7fc;
  Clause *in_stack_fffffffffffff800;
  undefined4 in_stack_fffffffffffff808;
  undefined4 in_stack_fffffffffffff80c;
  float fVar8;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffff828;
  undefined6 in_stack_fffffffffffff830;
  undefined1 in_stack_fffffffffffff836;
  uchar in_stack_fffffffffffff837;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff840;
  Color in_stack_fffffffffffff84c;
  undefined4 in_stack_fffffffffffff878;
  undefined4 in_stack_fffffffffffff87c;
  undefined4 in_stack_fffffffffffff888;
  uint in_stack_fffffffffffff88c;
  uint uVar9;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>
  *in_stack_fffffffffffff8c8;
  Unit *in_stack_fffffffffffff8d0;
  Unit *this_00;
  allocator<char> local_6d9;
  string local_6d8 [20];
  uint in_stack_fffffffffffff93c;
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [16];
  SplitSet *in_stack_fffffffffffff9b8;
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [39];
  allocator<char> local_5d1;
  string local_5d0 [32];
  string local_5b0 [39];
  allocator<char> local_589;
  string local_588 [32];
  string local_568 [39];
  undefined1 local_541 [33];
  string local_520 [39];
  undefined1 local_4f9 [33];
  string local_4d8 [39];
  allocator<char> local_4b1;
  string local_4b0 [32];
  string local_490 [32];
  string local_470 [39];
  allocator<char> local_449;
  string local_448 [32];
  string local_428 [32];
  string local_408 [39];
  allocator<char> local_3e1;
  string local_3e0 [32];
  string local_3c0 [36];
  uint local_39c;
  string local_398 [39];
  allocator<char> local_371;
  string local_370 [32];
  string local_350 [36];
  uint local_32c;
  string local_328 [39];
  allocator<char> local_301;
  string local_300 [32];
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [39];
  allocator<char> local_231;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [39];
  undefined1 local_149;
  string local_148 [40];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [36];
  uint local_bc;
  uint *local_b8;
  uint *local_b0;
  Stack<unsigned_int> *local_a8;
  int local_a0;
  Stack<unsigned_int> local_90;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> local_70;
  undefined1 local_31 [49];
  
  this_00 = (Unit *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
             (allocator<char> *)
             CONCAT17(in_stack_fffffffffffff837,
                      CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  PVar3 = Shell::Options::proofExtra(Lib::env);
  if (PVar3 != OFF) {
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::DHMap
              (&local_70);
    SortHelper::collectVariableSorts(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::domain
              (in_stack_fffffffffffff828);
    Lib::Stack<unsigned_int>::fromIterator<Lib::VirtualIterator<unsigned_int>>
              ((VirtualIterator<unsigned_int> *)in_stack_fffffffffffff828);
    Lib::VirtualIterator<unsigned_int>::~VirtualIterator
              ((VirtualIterator<unsigned_int> *)in_stack_fffffffffffff800);
    Lib::Stack<unsigned_int>::sort<std::less<unsigned_int>>(&local_90);
    sVar6 = Lib::Stack<unsigned_int>::size(&local_90);
    local_a0 = (int)sVar6;
    if (local_a0 != 0) {
      std::__cxx11::string::operator+=((string *)(local_31 + 1),"![");
      local_a8 = &local_90;
      local_b0 = Lib::Stack<unsigned_int>::begin(local_a8);
      local_b8 = Lib::Stack<unsigned_int>::end(local_a8);
      for (; local_b0 != local_b8; local_b0 = local_b0 + 1) {
        local_bc = *local_b0;
        TermList::TermList((TermList *)in_stack_fffffffffffff800,(uint)in_stack_fffffffffffff7fc,
                           (bool)in_stack_fffffffffffff7fb);
        TermList::toString_abi_cxx11_
                  ((TermList *)in_stack_fffffffffffff838,(bool)in_stack_fffffffffffff837);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                       (char *)in_stack_fffffffffffff800);
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::get
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
                   in_stack_fffffffffffff800,(uint)in_stack_fffffffffffff7fc);
        TermList::toString_abi_cxx11_
                  ((TermList *)in_stack_fffffffffffff838,(bool)in_stack_fffffffffffff837);
        std::operator+(in_stack_fffffffffffff838,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffff837,
                                CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
        std::__cxx11::string::operator+=((string *)(local_31 + 1),local_e0);
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string(local_148);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::~string(local_120);
        local_a0 = local_a0 + -1;
        if (local_a0 != 0) {
          std::__cxx11::string::operator+=((string *)(local_31 + 1),", ");
        }
      }
      std::__cxx11::string::operator+=((string *)(local_31 + 1),"]: ");
    }
    Lib::Stack<unsigned_int>::~Stack((Stack<unsigned_int> *)in_stack_fffffffffffff800);
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::~DHMap
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2> *)
               in_stack_fffffffffffff800);
  }
  local_149 = 0;
  Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff93c);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                 (char *)in_stack_fffffffffffff800);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff800);
  literalsOnlyToString_abi_cxx11_
            ((Clause *)CONCAT44(in_stack_fffffffffffff87c,in_stack_fffffffffffff878));
  std::operator+(in_stack_fffffffffffff838,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffff837,
                          CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
  std::__cxx11::string::~string(local_1d0);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::~string(local_190);
  std::__cxx11::string::~string(local_1b0);
  pSVar7 = splits((Clause *)0x84324c);
  if (pSVar7 != (SplitSet *)0x0) {
    pSVar7 = splits((Clause *)0x843275);
    bVar1 = Lib::SharedSet<unsigned_int>::isEmpty(pSVar7);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffff837,
                          CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      splits((Clause *)0x8432e6);
      Saturation::Splitter::splitsToString_abi_cxx11_(in_stack_fffffffffffff9b8);
      std::operator+(in_stack_fffffffffffff838,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff837,
                              CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                     (char *)in_stack_fffffffffffff800);
      std::__cxx11::string::operator+=((string *)in_RDI,local_1f0);
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_210);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_230);
      std::allocator<char>::~allocator(&local_231);
    }
  }
  Unit::inferenceAsString_abi_cxx11_(this_00);
  std::operator+((char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff800);
  std::__cxx11::string::operator+=((string *)in_RDI,local_278);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_298);
  PVar3 = Shell::Options::proofExtra(Lib::env);
  if (PVar3 != OFF) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
    std::__cxx11::string::operator+=((string *)in_RDI,local_2b8);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
    uVar4 = age((Clause *)0x843630);
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff93c);
    std::operator+(in_stack_fffffffffffff838,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff837,
                            CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
    std::__cxx11::string::operator+=((string *)in_RDI,local_2e0);
    std::__cxx11::string::~string(local_2e0);
    std::__cxx11::string::~string(local_328);
    std::__cxx11::string::~string(local_300);
    std::allocator<char>::~allocator(&local_301);
    if (in_RSI->_weight == 0) {
      in_stack_fffffffffffff88c = computeWeight(in_stack_fffffffffffff800);
      uVar9 = in_stack_fffffffffffff88c;
    }
    else {
      uVar9 = in_RSI->_weight;
    }
    local_32c = uVar9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffff837,
                        CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff93c);
    std::operator+(in_stack_fffffffffffff838,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffff837,
                            CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
    std::__cxx11::string::operator+=((string *)in_RDI,local_350);
    std::__cxx11::string::~string(local_350);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_370);
    std::allocator<char>::~allocator(&local_371);
    if (in_RSI->_weightForClauseSelection == 0) {
      local_39c = computeWeightForClauseSelection
                            ((Clause *)CONCAT44(uVar4,uVar9),
                             (Options *)
                             CONCAT44(in_stack_fffffffffffff88c,in_stack_fffffffffffff888));
    }
    else {
      local_39c = in_RSI->_weightForClauseSelection;
    }
    if (local_39c != local_32c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffff837,
                          CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff93c);
      std::operator+(in_stack_fffffffffffff838,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff837,
                              CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      std::__cxx11::string::operator+=((string *)in_RDI,local_3c0);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_408);
      std::__cxx11::string::~string(local_3e0);
      std::allocator<char>::~allocator(&local_3e1);
    }
    uVar4 = numSelected(in_RSI);
    if (uVar4 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffff837,
                          CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      numSelected(in_RSI);
      Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff93c);
      std::operator+(in_stack_fffffffffffff838,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff837,
                              CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      std::__cxx11::string::operator+=((string *)in_RDI,local_428);
      std::__cxx11::string::~string(local_428);
      std::__cxx11::string::~string(local_470);
      std::__cxx11::string::~string(local_448);
      std::allocator<char>::~allocator(&local_449);
    }
    if ((DAT_01333880 & 1) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffff837,
                          CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      in_stack_fffffffffffff84c = color(in_stack_fffffffffffff800);
      Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff84c);
      std::operator+(in_stack_fffffffffffff838,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff837,
                              CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      std::__cxx11::string::operator+=((string *)in_RDI,local_490);
      std::__cxx11::string::~string(local_490);
      std::__cxx11::string::~string(local_4d8);
      std::__cxx11::string::~string(local_4b0);
      std::allocator<char>::~allocator(&local_4b1);
    }
    bVar1 = Unit::derivedFromGoal((Unit *)0x843e07);
    if (bVar1) {
      in_stack_fffffffffffff840 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffff837,
                          CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      std::__cxx11::string::operator+=((string *)in_RDI,(string *)(local_4f9 + 1));
      std::__cxx11::string::~string((string *)(local_4f9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_4f9);
    }
    if (1 < DAT_01333848) {
      in_stack_fffffffffffff838 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_541;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffff837,
                          CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      in_stack_fffffffffffff837 = Inference::getSineLevel(&(in_RSI->super_Unit)._inference);
      Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff93c);
      std::operator+(in_stack_fffffffffffff838,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff837,
                              CONCAT16(in_stack_fffffffffffff836,in_stack_fffffffffffff830)));
      std::__cxx11::string::operator+=((string *)in_RDI,local_520);
      std::__cxx11::string::~string(local_520);
      std::__cxx11::string::~string(local_568);
      std::__cxx11::string::~string((string *)(local_541 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_541);
    }
    uVar2 = Unit::isPureTheoryDescendant((Unit *)0x84403c);
    if ((bool)uVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffff837,CONCAT16(uVar2,in_stack_fffffffffffff830)));
      std::__cxx11::string::operator+=((string *)in_RDI,local_588);
      std::__cxx11::string::~string(local_588);
      std::allocator<char>::~allocator(&local_589);
    }
    IVar5 = Shell::Options::induction(Lib::env);
    if (IVar5 != NONE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)
                 CONCAT17(in_stack_fffffffffffff837,CONCAT16(uVar2,in_stack_fffffffffffff830)));
      Inference::inductionDepth(&(in_RSI->super_Unit)._inference);
      Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff93c);
      std::operator+(in_stack_fffffffffffff838,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffff837,CONCAT16(uVar2,in_stack_fffffffffffff830)));
      std::__cxx11::string::operator+=((string *)in_RDI,local_5b0);
      std::__cxx11::string::~string(local_5b0);
      std::__cxx11::string::~string(local_5f8);
      std::__cxx11::string::~string(local_5d0);
      std::allocator<char>::~allocator(&local_5d1);
    }
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff84c);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff800);
    std::__cxx11::string::operator+=((string *)in_RDI,local_618);
    std::__cxx11::string::~string(local_618);
    std::__cxx11::string::~string(local_638);
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff84c);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffff80c,in_stack_fffffffffffff808),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff800);
    std::__cxx11::string::operator+=((string *)in_RDI,local_658);
    std::__cxx11::string::~string(local_658);
    std::__cxx11::string::~string(local_678);
    fVar8 = (in_RSI->super_Unit)._inference.th_ancestors;
    Shell::Options::theorySplitQueueExpectedRatioDenom(Lib::env);
    Lib::Int::toString_abi_cxx11_(in_stack_fffffffffffff7fc);
    std::operator+((char *)CONCAT44(fVar8,in_stack_fffffffffffff808),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff800);
    std::__cxx11::string::operator+=((string *)in_RDI,local_698);
    std::__cxx11::string::~string(local_698);
    std::__cxx11::string::~string(local_6b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffff837,CONCAT16(uVar2,in_stack_fffffffffffff830)));
    std::__cxx11::string::operator+=((string *)in_RDI,local_6d8);
    std::__cxx11::string::~string(local_6d8);
    std::allocator<char>::~allocator(&local_6d9);
  }
  local_149 = 1;
  std::__cxx11::string::~string((string *)(local_31 + 1));
  return in_RDI;
}

Assistant:

std::string Clause::toString() const
{
  std::string quantifier = "";
  if(env.options->proofExtra() != Options::ProofExtra::OFF){
    DHMap<unsigned,TermList> varSortMap;
    SortHelper::collectVariableSorts(const_cast<Clause*>(this),varSortMap);
    auto vars = Stack<unsigned>::fromIterator(varSortMap.domain());
    vars.sort();
    unsigned numVars = vars.size();
    if (numVars) {
      quantifier += "![";
      for (auto var : vars) {
        quantifier += TermList(var,false).toString() + ":" + varSortMap.get(var).toString();
        if (--numVars) {
          quantifier += ", ";
        }
      }
      quantifier += "]: ";
    }
  }

  // print id and literals of clause
  std::string result = Int::toString(_number) + ". "+ quantifier + literalsOnlyToString();

  // print avatar components clause depends on
  if (splits() && !splits()->isEmpty()) {
    result += std::string(" <- (") + Splitter::splitsToString(splits()) + ")";
  }

  // print inference and ids of parent clauses
  result += " " + inferenceAsString();

  if(env.options->proofExtra() != Options::ProofExtra::OFF){
    // print statistics: each entry should have the form key:value
    result += std::string(" {");

    result += std::string("a:") + Int::toString(age());
    unsigned weight = (_weight ? _weight : computeWeight());
    result += std::string(",w:") + Int::toString(weight);

    unsigned weightForClauseSelection = (_weightForClauseSelection ? _weightForClauseSelection : computeWeightForClauseSelection(*env.options));
    if(weightForClauseSelection!=weight){
      result += std::string(",wCS:") + Int::toString(weightForClauseSelection);
    }

    if (numSelected()>0) {
      result += std::string(",nSel:") + Int::toString(numSelected());
    }

    if (env.colorUsed) {
      result += std::string(",col:") + Int::toString(color());
    }

    if(derivedFromGoal()){
      result += std::string(",goal:1");
    }
    if(env.maxSineLevel > 1) { // this is a cryptic way of saying "did we run Sine to compute sine levels?"
      result += std::string(",sine:")+Int::toString((unsigned)_inference.getSineLevel());
    }

    if(isPureTheoryDescendant()){
      result += std::string(",ptD:1");
    }

    if(env.options->induction() != Shell::Options::Induction::NONE){
      result += std::string(",inD:") + Int::toString(_inference.inductionDepth());
    }
    result += ",thAx:" + Int::toString((int)(_inference.th_ancestors));
    result += ",allAx:" + Int::toString((int)(_inference.all_ancestors));

    result += ",thDist:" + Int::toString( _inference.th_ancestors * env.options->theorySplitQueueExpectedRatioDenom() - _inference.all_ancestors);
    result += std::string("}");
  }

  return result;
}